

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.h
# Opt level: O2

void zarray_add(zarray_t *za,void *p)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  if (za == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0xb5,"void zarray_add(zarray_t *, const void *)");
  }
  if (p == (void *)0x0) {
    __assert_fail("p != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0xb6,"void zarray_add(zarray_t *, const void *)");
  }
  iVar4 = za->size;
  iVar2 = za->alloc;
  if (iVar4 < iVar2) {
    pcVar3 = za->data;
  }
  else {
    while (iVar2 <= iVar4) {
      bVar1 = iVar2 < 4;
      iVar2 = iVar2 * 2;
      if (bVar1) {
        iVar2 = 8;
      }
      za->alloc = iVar2;
    }
    pcVar3 = (char *)realloc(za->data,(long)iVar2 * za->el_sz);
    za->data = pcVar3;
    iVar4 = za->size;
  }
  memcpy(pcVar3 + (long)iVar4 * za->el_sz,p,za->el_sz);
  za->size = za->size + 1;
  return;
}

Assistant:

static inline void zarray_add(zarray_t *za, const void *p)
{
    assert(za != NULL);
    assert(p != NULL);

    zarray_ensure_capacity(za, za->size + 1);

    memcpy(&za->data[za->size*za->el_sz], p, za->el_sz);
    za->size++;
}